

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

void __thiscall DnsStats::ExportStatsByIp(DnsStats *this)

{
  DnsStats *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  StatsByIP *this_01;
  ulong uVar7;
  uint uVar8;
  bool stored;
  DnsHashEntry key;
  bool local_f1;
  DnsStats *local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  BinHash<StatsByIP> *local_b0;
  ulong local_a8;
  ulong local_a0;
  DnsHashEntry local_98;
  
  local_f0 = this;
  if ((this->statsByIp).tableSize == 0) {
    local_98.count = 0;
    local_b8 = 0;
    local_a0 = 0;
    local_d0 = 0;
    local_e8 = 0;
    local_c0 = 0;
    local_a8 = 0;
    local_e0 = 0;
    local_c8 = 0;
    local_d8 = 0;
    uVar7 = 0;
  }
  else {
    local_e8 = 0;
    local_b8 = 0;
    local_e0 = local_e0 & 0xffffffff00000000;
    uVar4 = 0;
    uVar8 = 0;
    uVar3 = 0;
    uVar6 = 0;
    uVar5 = 0;
    local_c0 = local_c0 & 0xffffffff00000000;
    local_c8 = local_c8 & 0xffffffff00000000;
    local_d8 = local_d8 & 0xffffffff00000000;
    local_d0 = local_d0 & 0xffffffff00000000;
    do {
      for (this_01 = (local_f0->statsByIp).hashBin[local_b8]; this_01 != (StatsByIP *)0x0;
          this_01 = this_01->HashNext) {
        uVar2 = (uint)this_01->query_seen;
        if (this_01->response_seen == true) {
          local_b0 = (BinHash<StatsByIP> *)CONCAT44(local_b0._4_4_,(uint)this_01->query_seen);
          bVar1 = StatsByIP::IsDoUsed(this_01);
          local_d0 = CONCAT44(local_d0._4_4_,(int)local_d0 + (uint)bVar1);
          local_d8 = CONCAT44(local_d8._4_4_,(int)local_d8 + (uint)!bVar1);
          bVar1 = StatsByIP::IsEdnsSupported(this_01);
          local_c8 = CONCAT44(local_c8._4_4_,(int)local_c8 + (uint)bVar1);
          local_c0 = CONCAT44(local_c0._4_4_,(int)local_c0 + (uint)!bVar1);
          bVar1 = StatsByIP::IsQnameMinimized(this_01);
          uVar5 = uVar5 + bVar1;
          uVar6 = uVar6 + !bVar1;
          if (this_01->nb_recursive_queries == 0) {
            local_e8 = (ulong)((int)local_e8 + 1);
          }
          else {
            local_e0 = CONCAT44(local_e0._4_4_,(int)local_e0 + 1);
          }
          uVar2 = (uint)local_b0;
        }
        uVar3 = uVar3 + uVar2;
        uVar4 = (ulong)(((int)uVar4 + 1) - (uint)(this_01->nb_tcp_443 == 0));
        uVar8 = (uVar8 + 1) - (uint)(this_01->nb_tcp_583 == 0);
      }
      local_b8 = local_b8 + 1;
    } while (local_b8 < (local_f0->statsByIp).tableSize);
    local_98.count = local_d8 & 0xffffffff;
    local_d8 = local_e8 & 0xffffffff;
    uVar7 = local_d0 & 0xffffffff;
    local_a0 = local_c0 & 0xffffffff;
    local_b8 = local_c8 & 0xffffffff;
    local_e8 = (ulong)uVar6;
    local_d0 = (ulong)uVar5;
    local_c8 = local_e0 & 0xffffffff;
    local_c0 = (ulong)uVar3;
    local_a8 = (ulong)uVar8;
    local_e0 = uVar4;
  }
  local_b0 = &local_f0->statsByIp;
  local_98.field_6.key_number = 0;
  local_98.HashNext = (DnsHashEntry *)0x0;
  local_f1 = false;
  local_98.hash = 0;
  local_98.registry_id = 0x29;
  local_98.key_type = 0;
  local_98.key_length = 4;
  BinHash<DnsHashEntry>::InsertOrAdd(&local_f0->hashTable,&local_98,true,&local_f1);
  local_98.HashNext = (DnsHashEntry *)0x0;
  local_f1 = false;
  local_98.hash = 0;
  local_98.registry_id = 0x29;
  local_98.key_type = 0;
  local_98.key_length = 4;
  local_98.field_6.key_number = 1;
  local_98.count = uVar7;
  BinHash<DnsHashEntry>::InsertOrAdd(&local_f0->hashTable,&local_98,true,&local_f1);
  local_98.field_6.key_number = 0;
  local_98.HashNext = (DnsHashEntry *)0x0;
  local_f1 = false;
  local_98.count = local_a0;
  local_98.hash = 0;
  local_98.registry_id = 0x2b;
  local_98.key_type = 0;
  local_98.key_length = 4;
  BinHash<DnsHashEntry>::InsertOrAdd(&local_f0->hashTable,&local_98,true,&local_f1);
  local_98.HashNext = (DnsHashEntry *)0x0;
  local_f1 = false;
  local_98.count = local_b8;
  local_98.hash = 0;
  local_98.registry_id = 0x2b;
  local_98.key_type = 0;
  local_98.key_length = 4;
  local_98.field_6.key_number = 1;
  BinHash<DnsHashEntry>::InsertOrAdd(&local_f0->hashTable,&local_98,true,&local_f1);
  local_98.field_6.key_number = 0;
  local_98.HashNext = (DnsHashEntry *)0x0;
  local_f1 = false;
  local_98.count = local_e8;
  local_98.hash = 0;
  local_98.registry_id = 0x2c;
  local_98.key_type = 0;
  local_98.key_length = 4;
  BinHash<DnsHashEntry>::InsertOrAdd(&local_f0->hashTable,&local_98,true,&local_f1);
  local_98.HashNext = (DnsHashEntry *)0x0;
  local_f1 = false;
  local_98.count = local_d0;
  local_98.hash = 0;
  local_98.registry_id = 0x2c;
  local_98.key_type = 0;
  local_98.key_length = 4;
  local_98.field_6.key_number = 1;
  BinHash<DnsHashEntry>::InsertOrAdd(&local_f0->hashTable,&local_98,true,&local_f1);
  local_98.field_6.key_number = 0;
  local_98.HashNext = (DnsHashEntry *)0x0;
  local_f1 = false;
  local_98.count = local_d8;
  local_98.hash = 0;
  local_98.registry_id = 0x41;
  local_98.key_type = 0;
  local_98.key_length = 4;
  BinHash<DnsHashEntry>::InsertOrAdd(&local_f0->hashTable,&local_98,true,&local_f1);
  this_00 = local_f0;
  local_98.HashNext = (DnsHashEntry *)0x0;
  local_f1 = false;
  local_98.count = local_c8;
  local_98.hash = 0;
  local_98.registry_id = 0x41;
  local_98.key_type = 0;
  local_98.key_length = 4;
  local_98.field_6.key_number = 1;
  BinHash<DnsHashEntry>::InsertOrAdd(&local_f0->hashTable,&local_98,true,&local_f1);
  local_98.field_6.key_number = 0;
  local_98.HashNext = (DnsHashEntry *)0x0;
  local_f1 = false;
  local_98.count = local_c0;
  local_98.hash = 0;
  local_98.registry_id = 0x2e;
  local_98.key_type = 0;
  local_98.key_length = 4;
  BinHash<DnsHashEntry>::InsertOrAdd(&this_00->hashTable,&local_98,true,&local_f1);
  if (this_00->is_capture_dns_only == false) {
    local_98.count = (uint64_t)(this_00->statsByIp).tableSize;
    local_98.field_6.key_number = 0;
    local_98.HashNext = (DnsHashEntry *)0x0;
    local_f1 = false;
    local_98.hash = 0;
    local_98.registry_id = 0x30;
    local_98.key_type = 0;
    local_98.key_length = 4;
    BinHash<DnsHashEntry>::InsertOrAdd(&this_00->hashTable,&local_98,true,&local_f1);
    local_98.HashNext = (DnsHashEntry *)0x0;
    local_f1 = false;
    local_98.count = local_a8;
    local_98.hash = 0;
    local_98.registry_id = 0x30;
    local_98.key_type = 0;
    local_98.key_length = 4;
    local_98.field_6.key_number = 0x247;
    BinHash<DnsHashEntry>::InsertOrAdd(&this_00->hashTable,&local_98,true,&local_f1);
    local_98.HashNext = (DnsHashEntry *)0x0;
    local_f1 = false;
    local_98.count = local_e0;
    local_98.hash = 0;
    local_98.registry_id = 0x30;
    local_98.key_type = 0;
    local_98.key_length = 4;
    local_98.field_6.key_number = 0x1bb;
    BinHash<DnsHashEntry>::InsertOrAdd(&this_00->hashTable,&local_98,true,&local_f1);
  }
  BinHash<StatsByIP>::Clear(local_b0);
  return;
}

Assistant:

void DnsStats::ExportStatsByIp()
{
    StatsByIP *sbi;
    uint32_t using_do_count = 0;
    uint32_t not_using_do_count = 0;
    uint32_t using_edns_count = 0;
    uint32_t not_using_edns_count = 0;
    uint32_t qname_minimizing_count = 0;
    uint32_t not_minimizing_count = 0;
    uint32_t total_queries = 0;
    uint32_t issued_syn_583 = 0;
    uint32_t issued_syn_443 = 0;
    uint32_t sending_recursive_count = 0;
    uint32_t not_sending_recursive_count = 0;

    for (uint32_t i = 0; i < statsByIp.GetSize(); i++)
    {
        sbi = statsByIp.GetEntry(i);

        while (sbi != NULL)
        {
            if (sbi->query_seen) {
                total_queries++;
            }

            if (sbi->response_seen) {
                if (sbi->IsDoUsed()) {
                    using_do_count++;
                }
                else {
                    not_using_do_count++;
                }

                if (sbi->IsEdnsSupported()) {
                    using_edns_count++;
                }
                else {
                    not_using_edns_count++;
                }

                if (sbi->IsQnameMinimized()) {
                    qname_minimizing_count++;
                }
                else {
                    not_minimizing_count++;
                }

                if (sbi->nb_recursive_queries > 0) {
                    sending_recursive_count++;
                }
                else {
                    not_sending_recursive_count++;
                }
            }

            if (sbi->nb_tcp_443 > 0) {
                issued_syn_443++;
            }

            if (sbi->nb_tcp_583 > 0) {
                issued_syn_583++;
            }

            sbi = sbi->HashNext;
        }
    }

    SubmitRegistryNumberAndCount(REGISTRY_DNSSEC_Client_Usage, 0, not_using_do_count);
    SubmitRegistryNumberAndCount(REGISTRY_DNSSEC_Client_Usage, 1, using_do_count);

    SubmitRegistryNumberAndCount(REGISTRY_EDNS_Client_Usage, 0, not_using_edns_count);
    SubmitRegistryNumberAndCount(REGISTRY_EDNS_Client_Usage, 1, using_edns_count);

    SubmitRegistryNumberAndCount(REGISTRY_QNAME_MINIMIZATION_Usage, 0, not_minimizing_count);
    SubmitRegistryNumberAndCount(REGISTRY_QNAME_MINIMIZATION_Usage, 1, qname_minimizing_count);

    SubmitRegistryNumberAndCount(REGISTRY_RESOLVER_SENDING_RECURSIVE, 0, not_sending_recursive_count);
    SubmitRegistryNumberAndCount(REGISTRY_RESOLVER_SENDING_RECURSIVE, 1, sending_recursive_count);

    SubmitRegistryNumberAndCount(REGISTRY_EDNS_OPT_USAGE_REF, 0, total_queries);

    if (!is_capture_dns_only) {
        /* Only add these counts if using PCAP directly, not DNSCAP */
        SubmitRegistryNumberAndCount(REGISTRY_TCPSYN_PER_PROTO, 0, statsByIp.GetSize());
        SubmitRegistryNumberAndCount(REGISTRY_TCPSYN_PER_PROTO, 583, issued_syn_583);
        SubmitRegistryNumberAndCount(REGISTRY_TCPSYN_PER_PROTO, 443, issued_syn_443);
    }

    statsByIp.Clear();
}